

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_group_ops(ConvolutionDepthWise_x86 *this,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  pointer ppLVar4;
  pointer ppLVar5;
  long *plVar6;
  long lVar7;
  int *piVar8;
  Allocator *pAVar9;
  ulong uVar10;
  int iVar11;
  Layer *pLVar12;
  long lVar13;
  _func_int *p_Var14;
  int iVar15;
  void *in_R8;
  int i;
  long lVar16;
  uint uVar17;
  void *pvVar18;
  int i_00;
  _func_int **pp_Var19;
  bool bVar20;
  int local_290;
  int local_28c;
  undefined1 local_288 [76];
  int local_23c;
  Mat local_238;
  _func_int **local_1f0;
  int *piStack_1e8;
  long local_1e0;
  int local_1d8;
  Allocator *local_1d0;
  uint local_1c8;
  int iStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  uint local_1b8;
  size_t local_1b0;
  _func_int **local_1a8;
  int *piStack_1a0;
  long local_198;
  int local_190;
  Allocator *local_188;
  uint local_180;
  int iStack_17c;
  uint uStack_178;
  int iStack_174;
  int local_170;
  size_t local_168;
  void *local_160;
  int *piStack_158;
  long lStack_150;
  undefined4 uStack_148;
  long *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_128;
  undefined8 local_120;
  void *local_118;
  int *piStack_110;
  long lStack_108;
  undefined4 uStack_100;
  long *local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined4 local_e0;
  undefined8 local_d8;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_c8;
  size_t local_c0;
  Allocator *local_b8;
  long local_b0;
  Mat local_a8;
  size_t local_60;
  Option *local_58;
  undefined1 *local_50;
  size_t local_48;
  ParamDict pd;
  
  p_Var14 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar11 = *(int *)(&this->field_0xd0 + (long)p_Var14);
  iVar15 = *(int *)(&this->field_0xd8 + (long)p_Var14) * *(int *)(&this->field_0xd4 + (long)p_Var14)
  ;
  iVar2 = *(int *)(&this->field_0x108 + (long)p_Var14);
  uVar10 = (long)*(int *)(&this->field_0x104 + (long)p_Var14) / (long)iVar2;
  uVar10 = (long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) / (long)iVar15;
  local_c8 = &this->group_ops;
  lVar16 = 0;
  local_58 = opt;
  while( true ) {
    ppLVar4 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar5 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar5 - (long)ppLVar4) >> 3) <= lVar16) break;
    if (ppLVar4[lVar16] != (Layer *)0x0) {
      (*ppLVar4[lVar16]->_vptr_Layer[1])();
    }
    lVar16 = lVar16 + 1;
  }
  if (ppLVar5 != ppLVar4) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar4;
  }
  iVar3 = *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
  i_00 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) / iVar3;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_c8,(long)iVar3);
  local_50 = &this->field_0x118;
  local_23c = (((int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) /
                     (long)(iVar11 / iVar2)) * iVar2) / iVar3) * iVar15 * i_00;
  local_48 = (size_t)local_23c;
  local_60 = (size_t)i_00;
  lVar16 = 0;
  while( true ) {
    local_238.c = 1;
    p_Var14 = this->_vptr_ConvolutionDepthWise_x86[-3];
    if (*(int *)(&this->field_0x108 + (long)p_Var14) <= lVar16) break;
    local_238.elemsize = *(size_t *)(&this->field_0x178 + (long)p_Var14);
    local_238.data =
         (void *)(lVar16 * local_48 * local_238.elemsize +
                 *(long *)(&this->field_0x168 + (long)p_Var14));
    local_238.elempack = *(int *)(&this->field_0x180 + (long)p_Var14);
    local_238.allocator = *(Allocator **)(&this->field_0x188 + (long)p_Var14);
    local_238.refcount = (int *)0x0;
    local_238.dims = 1;
    local_238.w = (int)local_48;
    local_238.h = 1;
    local_238.d = 1;
    local_238.cstep = local_48;
    Mat::clone(&local_a8,(__fn *)&local_238,(void *)0x0,(int)local_238.data,in_R8);
    if (local_238.refcount != (int *)0x0) {
      LOCK();
      *local_238.refcount = *local_238.refcount + -1;
      UNLOCK();
      if (*local_238.refcount == 0) {
        if (local_238.allocator == (Allocator *)0x0) {
          free(local_238.data);
        }
        else {
          (*(local_238.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    p_Var14 = this->_vptr_ConvolutionDepthWise_x86[-3];
    bVar20 = *(int *)(&this->field_0x100 + (long)p_Var14) == 0;
    if (bVar20) {
      pp_Var19 = (_func_int **)0x0;
      local_b0 = 0;
      local_28c = 0;
      local_b8 = (Allocator *)0x0;
      local_290 = 0;
      local_c0 = 0;
    }
    else {
      local_b0 = *(long *)(&this->field_0x1c0 + (long)p_Var14);
      pp_Var19 = (_func_int **)
                 (lVar16 * local_60 * local_b0 + *(long *)(&this->field_0x1b0 + (long)p_Var14));
      local_28c = *(int *)(&this->field_0x1c8 + (long)p_Var14);
      local_b8 = *(Allocator **)(&this->field_0x1d0 + (long)p_Var14);
      local_c0 = local_60;
      local_290 = i_00;
    }
    uVar17 = (uint)!bVar20;
    pLVar12 = create_layer(6);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,i_00);
    ParamDict::set(&pd,1,*(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]
                                 ));
    ParamDict::set(&pd,0xb,*(int *)(&this->field_0xd8 +
                                   (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,2,*(int *)(&this->field_0xdc + (long)this->_vptr_ConvolutionDepthWise_x86[-3]
                                 ));
    ParamDict::set(&pd,0xc,*(int *)(&this->field_0xe0 +
                                   (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,3,*(int *)(&this->field_0xe4 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]
                                 ));
    ParamDict::set(&pd,0xd,*(int *)(&this->field_0xe8 +
                                   (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,4,0);
    ParamDict::set(&pd,0xe,0);
    ParamDict::set(&pd,5,*(int *)(&this->field_0x100 +
                                 (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,6,local_23c);
    ParamDict::set(&pd,8,*(int *)(&this->field_0x10c +
                                 (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,9,*(int *)(&this->field_0x110 +
                                 (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,10,(Mat *)(local_50 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    (*pLVar12->_vptr_Layer[2])(pLVar12,&pd);
    if (*(int *)(&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) == 0) {
      lVar13 = 0x40;
      do {
        *(undefined8 *)((long)&local_238.data + lVar13) = 0;
        *(undefined8 *)(local_288 + lVar13 + 0x10) = 0;
        *(undefined8 *)(local_288 + lVar13 + 0x18) = 0;
        *(undefined8 *)(local_288 + lVar13 + 0x1c) = 0;
        *(undefined8 *)(local_288 + lVar13 + 0x24) = 0;
        *(undefined8 *)(local_288 + lVar13 + 0x30) = 0;
        *(undefined8 *)(local_288 + lVar13 + 0x38) = 0;
        *(undefined8 *)(local_288 + lVar13 + 0x3c) = 0;
        *(undefined8 *)(local_288 + lVar13 + 0x44) = 0;
        lVar13 = lVar13 + 0x48;
      } while (lVar13 != 0x160);
      if (local_a8.refcount != (int *)0x0) {
        LOCK();
        *local_a8.refcount = *local_a8.refcount + 1;
        UNLOCK();
      }
      if (local_238.refcount != (int *)0x0) {
        LOCK();
        *local_238.refcount = *local_238.refcount + -1;
        UNLOCK();
        if (*local_238.refcount == 0) {
          if (local_238.allocator == (Allocator *)0x0) {
            free(local_238.data);
          }
          else {
            (*(local_238.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_238.data = local_a8.data;
      local_238.refcount = local_a8.refcount;
      local_238.elemsize = local_a8.elemsize;
      local_238.elempack = local_a8.elempack;
      local_238.allocator = local_a8.allocator;
      local_238.dims = local_a8.dims;
      local_238.w = local_a8.w;
      local_238.c = local_a8.c;
      local_238.cstep = local_a8.cstep;
      p_Var14 = this->_vptr_ConvolutionDepthWise_x86[-3];
      if (*(int *)(&this->field_0x10c + (long)p_Var14) != 0) {
        local_288._64_8_ = 0;
        local_288._0_8_ = (_func_int **)0x0;
        local_288._8_4_ = 0;
        local_288._12_4_ = 0;
        local_288._16_4_ = 0;
        local_288._20_4_ = 0;
        local_288._24_4_ = 0;
        local_288._48_4_ = 0;
        local_288._52_4_ = 0;
        local_288._56_4_ = 0;
        local_288._32_8_ = (Allocator *)0x0;
        local_288._40_4_ = 0;
        local_288._44_4_ = 0;
        Mat::create((Mat *)local_288,i_00,4,(Allocator *)0x0);
        uVar1 = *(undefined4 *)
                 (*(long *)(&this->field_0x1f8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) +
                 lVar16 * 4);
        iVar11 = local_288._56_4_ * local_288._64_4_;
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        for (lVar13 = 0; iVar11 != (int)lVar13; lVar13 = lVar13 + 1) {
          *(undefined4 *)(local_288._0_8_ + lVar13 * 4) = uVar1;
        }
        piVar8 = (int *)CONCAT44(local_288._12_4_,local_288._8_4_);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        if (piStack_1e8 != (int *)0x0) {
          LOCK();
          *piStack_1e8 = *piStack_1e8 + -1;
          UNLOCK();
          if (*piStack_1e8 == 0) {
            if (local_1d0 == (Allocator *)0x0) {
              free(local_1f0);
            }
            else {
              (*local_1d0->_vptr_Allocator[3])();
            }
          }
        }
        piStack_1e8 = (int *)CONCAT44(local_288._12_4_,local_288._8_4_);
        local_1f0 = (_func_int **)local_288._0_8_;
        local_1e0 = CONCAT44(local_288._20_4_,local_288._16_4_);
        local_1d8 = local_288._24_4_;
        local_1d0 = (Allocator *)local_288._32_8_;
        local_1c8 = local_288._40_4_;
        iStack_1c4 = local_288._44_4_;
        uStack_1c0 = local_288._48_4_;
        uStack_1bc = local_288._52_4_;
        local_1b8 = local_288._56_4_;
        local_1b0 = local_288._64_8_;
        p_Var14 = this->_vptr_ConvolutionDepthWise_x86[-3];
        lVar13 = *(long *)(&this->field_0x250 + (long)p_Var14);
        pp_Var19 = (_func_int **)(lVar13 * lVar16 + *(long *)(&this->field_0x240 + (long)p_Var14));
        iVar11 = *(int *)(&this->field_0x258 + (long)p_Var14);
        pAVar9 = *(Allocator **)(&this->field_0x260 + (long)p_Var14);
        if (piStack_1a0 != (int *)0x0) {
          LOCK();
          *piStack_1a0 = *piStack_1a0 + -1;
          UNLOCK();
          if (*piStack_1a0 == 0) {
            if (local_188 == (Allocator *)0x0) {
              free(local_1a8);
            }
            else {
              (*local_188->_vptr_Allocator[3])();
            }
          }
        }
        piStack_1a0 = (int *)0x0;
        local_180 = 1;
        iStack_17c = 1;
        uStack_178 = 1;
        iStack_174 = 1;
        local_170 = 1;
        local_168 = 1;
        piVar8 = (int *)CONCAT44(local_288._12_4_,local_288._8_4_);
        local_1a8 = pp_Var19;
        local_198 = lVar13;
        local_190 = iVar11;
        local_188 = pAVar9;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if ((Allocator *)local_288._32_8_ == (Allocator *)0x0) {
              free((void *)local_288._0_8_);
            }
            else {
              (*(*(_func_int ***)local_288._32_8_)[3])();
            }
          }
        }
        p_Var14 = this->_vptr_ConvolutionDepthWise_x86[-3];
      }
      if (100 < *(int *)(&this->field_0x10c + (long)p_Var14)) {
        lVar13 = *(long *)(&this->field_0x298 + (long)p_Var14);
        lVar7 = *(long *)(&this->field_0x288 + (long)p_Var14);
        uVar1 = *(undefined4 *)(&this->field_0x2a0 + (long)p_Var14);
        plVar6 = *(long **)(&this->field_0x2a8 + (long)p_Var14);
        if (piStack_158 != (int *)0x0) {
          LOCK();
          *piStack_158 = *piStack_158 + -1;
          UNLOCK();
          if (*piStack_158 == 0) {
            if (local_140 == (long *)0x0) {
              free(local_160);
            }
            else {
              (**(code **)(*local_140 + 0x18))();
            }
          }
        }
        piStack_158 = (int *)0x0;
        local_138 = 0x100000001;
        uStack_130 = 0x100000001;
        local_128 = 1;
        local_120 = 1;
        local_160 = (void *)(lVar13 * lVar16 + lVar7);
        lStack_150 = lVar13;
        uStack_148 = uVar1;
        local_140 = plVar6;
      }
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)local_288,&local_238);
      (*pLVar12->_vptr_Layer[3])(pLVar12,(ModelBinFromMatArray *)local_288);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)local_288);
      lVar13 = 0xd8;
      do {
        piVar8 = *(int **)((long)&local_238.refcount + lVar13);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            plVar6 = *(long **)((long)&local_238.allocator + lVar13);
            if (plVar6 == (long *)0x0) {
              free(*(void **)((long)&local_238.data + lVar13));
            }
            else {
              (**(code **)(*plVar6 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_238.cstep + lVar13) = 0;
        *(undefined8 *)((long)&local_238.refcount + lVar13 + 4) = 0;
        *(undefined8 *)((long)&local_238.elemsize + lVar13 + 4) = 0;
        *(undefined8 *)((long)&local_238.data + lVar13) = 0;
        *(undefined8 *)((long)&local_238.refcount + lVar13) = 0;
        *(undefined4 *)((long)&local_238.c + lVar13) = 0;
        *(undefined8 *)((long)&local_238.dims + lVar13) = 0;
        *(undefined8 *)((long)&local_238.h + lVar13) = 0;
        lVar13 = lVar13 + -0x48;
      } while (lVar13 != -0x48);
    }
    else {
      lVar13 = 0x40;
      do {
        *(undefined8 *)((long)&local_238.data + lVar13) = 0;
        *(undefined8 *)(local_288 + lVar13 + 0x10) = 0;
        *(undefined8 *)(local_288 + lVar13 + 0x18) = 0;
        *(undefined8 *)(local_288 + lVar13 + 0x1c) = 0;
        *(undefined8 *)(local_288 + lVar13 + 0x24) = 0;
        *(undefined8 *)(local_288 + lVar13 + 0x30) = 0;
        *(undefined8 *)(local_288 + lVar13 + 0x38) = 0;
        *(undefined8 *)(local_288 + lVar13 + 0x3c) = 0;
        *(undefined8 *)(local_288 + lVar13 + 0x44) = 0;
        lVar13 = lVar13 + 0x48;
      } while (lVar13 != 0x1a8);
      if (local_a8.refcount != (int *)0x0) {
        LOCK();
        *local_a8.refcount = *local_a8.refcount + 1;
        UNLOCK();
      }
      if (local_238.refcount != (int *)0x0) {
        LOCK();
        *local_238.refcount = *local_238.refcount + -1;
        UNLOCK();
        if (*local_238.refcount == 0) {
          if (local_238.allocator == (Allocator *)0x0) {
            free(local_238.data);
          }
          else {
            (*(local_238.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_238.data = local_a8.data;
      local_238.refcount = local_a8.refcount;
      local_238.elemsize = local_a8.elemsize;
      local_238.elempack = local_a8.elempack;
      local_238.allocator = local_a8.allocator;
      local_238.dims = local_a8.dims;
      local_238.w = local_a8.w;
      local_238.c = local_a8.c;
      local_238.cstep = local_a8.cstep;
      if (piStack_1e8 != (int *)0x0) {
        LOCK();
        *piStack_1e8 = *piStack_1e8 + -1;
        UNLOCK();
        if (*piStack_1e8 == 0) {
          if (local_1d0 == (Allocator *)0x0) {
            free(local_1f0);
          }
          else {
            (*local_1d0->_vptr_Allocator[3])();
          }
        }
      }
      piStack_1e8 = (int *)0x0;
      local_1e0 = local_b0;
      local_1d8 = local_28c;
      local_1d0 = local_b8;
      iStack_1c4 = local_290;
      local_1b0 = local_c0;
      p_Var14 = this->_vptr_ConvolutionDepthWise_x86[-3];
      local_1f0 = pp_Var19;
      local_1c8 = uVar17;
      uStack_1c0 = uVar17;
      uStack_1bc = uVar17;
      local_1b8 = uVar17;
      if (*(int *)(&this->field_0x10c + (long)p_Var14) != 0) {
        local_288._64_8_ = 0;
        local_288._0_8_ = (_func_int **)0x0;
        local_288._8_4_ = 0;
        local_288._12_4_ = 0;
        local_288._16_4_ = 0;
        local_288._20_4_ = 0;
        local_288._24_4_ = 0;
        local_288._48_4_ = 0;
        local_288._52_4_ = 0;
        local_288._56_4_ = 0;
        local_288._32_8_ = (Allocator *)0x0;
        local_288._40_4_ = 0;
        local_288._44_4_ = 0;
        Mat::create((Mat *)local_288,i_00,4,(Allocator *)0x0);
        uVar1 = *(undefined4 *)
                 (*(long *)(&this->field_0x1f8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) +
                 lVar16 * 4);
        iVar11 = local_288._56_4_ * local_288._64_4_;
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        for (lVar13 = 0; iVar11 != (int)lVar13; lVar13 = lVar13 + 1) {
          *(undefined4 *)(local_288._0_8_ + lVar13 * 4) = uVar1;
        }
        piVar8 = (int *)CONCAT44(local_288._12_4_,local_288._8_4_);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        if (piStack_1a0 != (int *)0x0) {
          LOCK();
          *piStack_1a0 = *piStack_1a0 + -1;
          UNLOCK();
          if (*piStack_1a0 == 0) {
            if (local_188 == (Allocator *)0x0) {
              free(local_1a8);
            }
            else {
              (*local_188->_vptr_Allocator[3])();
            }
          }
        }
        piStack_1a0 = (int *)CONCAT44(local_288._12_4_,local_288._8_4_);
        local_1a8 = (_func_int **)local_288._0_8_;
        local_198 = CONCAT44(local_288._20_4_,local_288._16_4_);
        local_190 = local_288._24_4_;
        local_188 = (Allocator *)local_288._32_8_;
        local_180 = local_288._40_4_;
        iStack_17c = local_288._44_4_;
        uStack_178 = local_288._48_4_;
        iStack_174 = local_288._52_4_;
        local_170 = local_288._56_4_;
        local_168 = local_288._64_8_;
        p_Var14 = this->_vptr_ConvolutionDepthWise_x86[-3];
        lVar13 = *(long *)(&this->field_0x250 + (long)p_Var14);
        pvVar18 = (void *)(lVar13 * lVar16 + *(long *)(&this->field_0x240 + (long)p_Var14));
        uVar1 = *(undefined4 *)(&this->field_0x258 + (long)p_Var14);
        plVar6 = *(long **)(&this->field_0x260 + (long)p_Var14);
        if (piStack_158 != (int *)0x0) {
          LOCK();
          *piStack_158 = *piStack_158 + -1;
          UNLOCK();
          if (*piStack_158 == 0) {
            if (local_140 == (long *)0x0) {
              free(local_160);
            }
            else {
              (**(code **)(*local_140 + 0x18))();
            }
          }
        }
        piStack_158 = (int *)0x0;
        local_138 = 0x100000001;
        uStack_130 = 0x100000001;
        local_128 = 1;
        local_120 = 1;
        piVar8 = (int *)CONCAT44(local_288._12_4_,local_288._8_4_);
        local_160 = pvVar18;
        lStack_150 = lVar13;
        uStack_148 = uVar1;
        local_140 = plVar6;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if ((Allocator *)local_288._32_8_ == (Allocator *)0x0) {
              free((void *)local_288._0_8_);
            }
            else {
              (*(*(_func_int ***)local_288._32_8_)[3])();
            }
          }
        }
        p_Var14 = this->_vptr_ConvolutionDepthWise_x86[-3];
      }
      if (100 < *(int *)(&this->field_0x10c + (long)p_Var14)) {
        lVar13 = *(long *)(&this->field_0x298 + (long)p_Var14);
        lVar7 = *(long *)(&this->field_0x288 + (long)p_Var14);
        uVar1 = *(undefined4 *)(&this->field_0x2a0 + (long)p_Var14);
        plVar6 = *(long **)(&this->field_0x2a8 + (long)p_Var14);
        if (piStack_110 != (int *)0x0) {
          LOCK();
          *piStack_110 = *piStack_110 + -1;
          UNLOCK();
          if (*piStack_110 == 0) {
            if (local_f8 == (long *)0x0) {
              free(local_118);
            }
            else {
              (**(code **)(*local_f8 + 0x18))();
            }
          }
        }
        piStack_110 = (int *)0x0;
        local_f0 = 0x100000001;
        uStack_e8 = 0x100000001;
        local_e0 = 1;
        local_d8 = 1;
        local_118 = (void *)(lVar13 * lVar16 + lVar7);
        lStack_108 = lVar13;
        uStack_100 = uVar1;
        local_f8 = plVar6;
      }
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)local_288,&local_238);
      (*pLVar12->_vptr_Layer[3])(pLVar12,(ModelBinFromMatArray *)local_288);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)local_288);
      lVar13 = 0x120;
      do {
        piVar8 = *(int **)((long)&local_238.refcount + lVar13);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            plVar6 = *(long **)((long)&local_238.allocator + lVar13);
            if (plVar6 == (long *)0x0) {
              free(*(void **)((long)&local_238.data + lVar13));
            }
            else {
              (**(code **)(*plVar6 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_238.cstep + lVar13) = 0;
        *(undefined8 *)((long)&local_238.refcount + lVar13 + 4) = 0;
        *(undefined8 *)((long)&local_238.elemsize + lVar13 + 4) = 0;
        *(undefined8 *)((long)&local_238.data + lVar13) = 0;
        *(undefined8 *)((long)&local_238.refcount + lVar13) = 0;
        *(undefined4 *)((long)&local_238.c + lVar13) = 0;
        *(undefined8 *)((long)&local_238.dims + lVar13) = 0;
        *(undefined8 *)((long)&local_238.h + lVar13) = 0;
        lVar13 = lVar13 + -0x48;
      } while (lVar13 != -0x48);
    }
    (*pLVar12->_vptr_Layer[4])(pLVar12,local_58);
    (local_c8->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar16] = pLVar12;
    ParamDict::~ParamDict(&pd);
    if (local_a8.refcount != (int *)0x0) {
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount == 0) {
        if (local_a8.allocator == (Allocator *)0x0) {
          free(local_a8.data);
        }
        else {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    lVar16 = lVar16 + 1;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}